

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::scanRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  BuildEngineDelegate *pBVar1;
  RuleInfo *this_00;
  bool bVar2;
  uint uVar3;
  pointer pRVar4;
  pointer pBVar5;
  RuleScanRecord *value;
  value_type local_40;
  RuleInfo *local_20;
  RuleInfo *ruleInfo_local;
  BuildEngineImpl *this_local;
  
  local_20 = ruleInfo;
  ruleInfo_local = (RuleInfo *)this;
  bVar2 = RuleInfo::isScanned(ruleInfo,this);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = RuleInfo::isScanning(local_20);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      llbuild::core::DependencyKeyIDs::cleanSingleUseDependencies(&(local_20->result).dependencies);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
      if (bVar2) {
        pBVar5 = std::
                 unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 ::operator->(&this->trace);
        pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&local_20->rule);
        llbuild::core::BuildEngineTrace::checkingRuleNeedsToRun(pBVar5,pRVar4);
      }
      pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
               operator->(&local_20->rule);
      (*pRVar4->_vptr_Rule[4])(pRVar4,this->buildEngine,0);
      local_20->wasForced = false;
      if ((local_20->result).builtAt == 0) {
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
        if (bVar2) {
          pBVar5 = std::
                   unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                   ::operator->(&this->trace);
          pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   get(&local_20->rule);
          llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseNeverBuilt(pBVar5,pRVar4);
        }
        local_20->state = NeedsToRun;
        pBVar1 = this->delegate;
        pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&local_20->rule);
        (*pBVar1->_vptr_BuildEngineDelegate[4])(pBVar1,pRVar4,0,0);
        this_local._7_1_ = true;
      }
      else {
        pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 operator->(&local_20->rule);
        bVar2 = llbuild::basic::CommandSignature::operator!=
                          (&pRVar4->signature,&(local_20->result).signature);
        if (bVar2) {
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
          if (bVar2) {
            pBVar5 = std::
                     unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                     ::operator->(&this->trace);
            pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                     ::get(&local_20->rule);
            llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseSignatureChanged(pBVar5,pRVar4);
          }
          local_20->state = NeedsToRun;
          pBVar1 = this->delegate;
          pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   get(&local_20->rule);
          (*pBVar1->_vptr_BuildEngineDelegate[4])(pBVar1,pRVar4,1,0);
          this_local._7_1_ = true;
        }
        else {
          pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   operator->(&local_20->rule);
          uVar3 = (*pRVar4->_vptr_Rule[3])(pRVar4,this->buildEngine,&local_20->result);
          if ((uVar3 & 1) == 0) {
            bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
            if (bVar2) {
              pBVar5 = std::
                       unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                       ::operator->(&this->trace);
              pRVar4 = std::
                       unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                       get(&local_20->rule);
              llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseInvalidValue(pBVar5,pRVar4);
            }
            local_20->state = NeedsToRun;
            pBVar1 = this->delegate;
            pRVar4 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                     ::get(&local_20->rule);
            (*pBVar1->_vptr_BuildEngineDelegate[4])(pBVar1,pRVar4,2,0);
            this_local._7_1_ = true;
          }
          else {
            bVar2 = llbuild::core::DependencyKeyIDs::empty(&(local_20->result).dependencies);
            if (bVar2) {
              bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
              if (bVar2) {
                pBVar5 = std::
                         unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                         ::operator->(&this->trace);
                pRVar4 = std::
                         unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                         ::get(&local_20->rule);
                llbuild::core::BuildEngineTrace::ruleDoesNotNeedToRun(pBVar5,pRVar4);
              }
              local_20->state = DoesNotNeedToRun;
              this_local._7_1_ = true;
            }
            else {
              bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
              if (bVar2) {
                pBVar5 = std::
                         unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                         ::operator->(&this->trace);
                pRVar4 = std::
                         unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                         ::get(&local_20->rule);
                llbuild::core::BuildEngineTrace::ruleScheduledForScanning(pBVar5,pRVar4);
              }
              this_00 = local_20;
              local_20->state = IsScanning;
              value = newRuleScanRecord(this);
              RuleInfo::setPendingScanRecord(this_00,value);
              local_40.ruleInfo = local_20;
              local_40.inputIndex = 0;
              local_40.inputRuleInfo = (RuleInfo *)0x0;
              local_40.orderOnly = false;
              local_40.singleUse = false;
              std::
              vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
              ::push_back(&this->ruleInfosToScan,&local_40);
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool scanRule(RuleInfo& ruleInfo) {
    // If the rule is already scanned, we are done.
    if (ruleInfo.isScanned(this))
      return true;

    // If the rule is being scanned, we don't need to do anything.
    if (ruleInfo.isScanning())
      return false;
    
    /// Cleans up single use dependencies that should not be considered for incremental builds.
    ruleInfo.result.dependencies.cleanSingleUseDependencies();

    // Otherwise, start scanning the rule.
    if (trace)
      trace->checkingRuleNeedsToRun(ruleInfo.rule.get());

    // Report the status change.
    ruleInfo.rule->updateStatus(buildEngine, Rule::StatusKind::IsScanning);

    ruleInfo.wasForced = false;

    // If the rule has never been run, it needs to run.
    if (ruleInfo.result.builtAt == 0) {
      if (trace)
        trace->ruleNeedsToRunBecauseNeverBuilt(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::NeverBuilt, nullptr);
      return true;
    }

    if (ruleInfo.rule->signature != ruleInfo.result.signature) {
      if (trace)
        trace->ruleNeedsToRunBecauseSignatureChanged(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::SignatureChanged, nullptr);
      return true;
    }

    // If the rule indicates its computed value is out of date, it needs to run.
    //
    // FIXME: We should probably try and move this so that it can be done by
    // clients in the background, either by us backgrounding it, or by using a
    // completion model as we do for inputs.
    if (!ruleInfo.rule->isResultValid(buildEngine, ruleInfo.result.value)) {
      if (trace)
        trace->ruleNeedsToRunBecauseInvalidValue(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::InvalidValue, nullptr);
      return true;
    }

    // If the rule has no dependencies, then it is ready to run.
    if (ruleInfo.result.dependencies.empty()) {
      if (trace)
        trace->ruleDoesNotNeedToRun(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::DoesNotNeedToRun;
      return true;
    }

    // Otherwise, we need to do a recursive scan of the inputs so enqueue this
    // rule for scanning.
    //
    // We could also take an approach where we enqueue each of the individual
    // inputs, but in my experiments with that approach it has always performed
    // significantly worse.
    if (trace)
      trace->ruleScheduledForScanning(ruleInfo.rule.get());
    ruleInfo.state = RuleInfo::StateKind::IsScanning;
    ruleInfo.setPendingScanRecord(newRuleScanRecord());
    ruleInfosToScan.push_back({ &ruleInfo, /*InputIndex=*/0, nullptr, false });

    return false;
  }